

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,floating_type f,
          floating_format_info *fmt,source_location *param_3)

{
  uint *puVar1;
  void *__s;
  size_type __n_00;
  void *pvVar2;
  size_type sVar3;
  ostream *poVar4;
  size_type sVar5;
  char *pcVar6;
  char *__data;
  size_type __n;
  string s;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  char *local_2b0;
  size_type local_2a8;
  char local_2a0;
  undefined7 uStack_29f;
  undefined8 local_298;
  char *local_290;
  size_type local_288;
  char local_280;
  undefined7 uStack_27f;
  undefined8 local_278;
  char *local_270;
  size_type local_268;
  char local_260;
  undefined7 uStack_25f;
  undefined8 local_258;
  char *local_250;
  size_type local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined8 local_238;
  char *local_230;
  size_type local_228;
  char local_220;
  undefined7 uStack_21f;
  undefined8 local_218;
  char *local_210;
  size_type local_208;
  char local_200;
  undefined7 uStack_1ff;
  undefined8 local_1f8;
  char *local_1f0;
  size_type local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  undefined8 local_1d8;
  char *local_1d0;
  size_type local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  undefined8 local_1b8;
  floating_type local_1b0;
  locale local_1a8 [8];
  long local_1a0;
  long local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_1b0 = f;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::locale::classic();
  std::ios::imbue(local_1a8);
  std::locale::~locale(local_1a8);
  if (NAN(local_1b0)) {
    if ((long)local_1b0 < 0) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"nan",3);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length
                );
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_1c8;
    sVar5 = CONCAT71(uStack_1bf,local_1c0);
    if (local_1d0 != &local_1c0) {
      local_1c8 = 0;
      local_1c0 = '\0';
      pcVar6 = local_1d0;
      local_1d0 = &local_1c0;
      goto LAB_003d747c;
    }
    local_1c8 = 0;
    local_1c0 = '\0';
    local_1d8 = local_1b8;
    goto LAB_003d761a;
  }
  if (ABS(local_1b0) == INFINITY) {
    if ((long)local_1b0 < 0) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x2d;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"inf",3);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,(char *)&local_2d0,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length
                );
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_1e8;
    sVar5 = CONCAT71(uStack_1df,local_1e0);
    if (local_1f0 != &local_1e0) {
      local_1e8 = 0;
      local_1e0 = '\0';
      pcVar6 = local_1f0;
      local_1f0 = &local_1e0;
      goto LAB_003d747c;
    }
    local_1e8 = 0;
    local_1e0 = '\0';
    goto LAB_003d761a;
  }
  switch(fmt->fmt) {
  case defaultfloat:
    if (fmt->prec != 0) {
      *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
    }
    std::ostream::_M_insert<double>(local_1b0);
    std::__cxx11::stringbuf::str();
    __n_00 = local_2d0._M_string_length;
    if (local_2d0._M_string_length == 0) {
LAB_003d755f:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_2d0,".0");
    }
    else {
      __s = (void *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_);
      pvVar2 = memchr(__s,0x2e,local_2d0._M_string_length);
      if (((pvVar2 == (void *)0x0 || (long)pvVar2 - (long)__s == -1) &&
          (pvVar2 = memchr(__s,0x65,__n_00), pvVar2 == (void *)0x0 || (long)pvVar2 - (long)__s == -1
          )) && (pvVar2 = memchr(__s,0x45,__n_00),
                pvVar2 == (void *)0x0 || (long)pvVar2 - (long)__s == -1)) goto LAB_003d755f;
    }
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_2d0,'_');
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(&local_2d0,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
    }
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,
               CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_),
               local_2d0._M_string_length +
               CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_));
    sVar5 = local_2a8;
    if (local_2b0 == &local_2a0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_29f,local_2a0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_298;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_2b0;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_29f,local_2a0);
      local_2b0 = &local_2a0;
    }
    local_2a0 = '\0';
    local_2a8 = 0;
    __return_storage_ptr__->_M_string_length = sVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_) !=
        &local_2d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_2d0._M_dataplus._M_p._1_7_,local_2d0._M_dataplus._M_p._0_1_),
                      local_2d0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_003d762d;
  case fixed:
    if (fmt->prec != 0) {
      *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
    }
    *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(local_1b0);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,(char *)&local_2d0,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_208;
    sVar5 = CONCAT71(uStack_1ff,local_200);
    if (local_210 == &local_200) {
      local_208 = 0;
      local_200 = '\0';
      local_1d8 = local_1f8;
      break;
    }
    local_208 = 0;
    local_200 = '\0';
    pcVar6 = local_210;
    local_210 = &local_200;
LAB_003d747c:
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = sVar5;
    goto LAB_003d7629;
  case scientific:
    if (fmt->prec != 0) {
      *(long *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = (long)(int)fmt->prec;
    }
    *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 0x100;
    std::ostream::_M_insert<double>(local_1b0);
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,(char *)&local_2d0,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_228;
    sVar5 = CONCAT71(uStack_21f,local_220);
    if (local_230 != &local_220) {
      local_228 = 0;
      local_220 = '\0';
      pcVar6 = local_230;
      local_230 = &local_220;
      goto LAB_003d747c;
    }
    local_228 = 0;
    local_220 = '\0';
    local_1d8 = local_218;
    break;
  case hex:
    if ((this->spec_).ext_hex_float == true) {
      puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18));
      *puVar1 = *puVar1 | 0x104;
      std::ostream::_M_insert<double>(local_1b0);
      std::__cxx11::stringbuf::str();
      sVar3 = local_248;
      sVar5 = CONCAT71(uStack_23f,local_240);
      if (local_250 != &local_240) {
        local_248 = 0;
        local_240 = '\0';
        pcVar6 = local_250;
        local_250 = &local_240;
        goto LAB_003d747c;
      }
      local_248 = 0;
      local_240 = '\0';
      local_1d8 = local_238;
    }
    else {
      *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 0x11;
      *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
           *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 0x100;
      std::ostream::_M_insert<double>(local_1b0);
      std::__cxx11::stringbuf::str();
      sVar3 = local_268;
      sVar5 = CONCAT71(uStack_25f,local_260);
      if (local_270 != &local_260) {
        local_268 = 0;
        local_260 = '\0';
        pcVar6 = local_270;
        local_270 = &local_260;
        goto LAB_003d747c;
      }
      local_268 = 0;
      local_260 = '\0';
      local_1d8 = local_258;
    }
    break;
  default:
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      local_2d0._M_dataplus._M_p._0_1_ = 0x5f;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a0,(char *)&local_2d0,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(fmt->suffix)._M_dataplus._M_p,(fmt->suffix)._M_string_length);
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_288;
    sVar5 = CONCAT71(uStack_27f,local_280);
    if (local_290 != &local_280) {
      local_288 = 0;
      local_280 = '\0';
      pcVar6 = local_290;
      local_290 = &local_280;
      goto LAB_003d747c;
    }
    local_288 = 0;
    local_280 = '\0';
    local_1d8 = local_278;
  }
LAB_003d761a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = sVar5;
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1d8;
LAB_003d7629:
  __return_storage_ptr__->_M_string_length = sVar3;
LAB_003d762d:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const floating_type f, const floating_format_info& fmt, const source_location&) // {{{
    {
        using std::isnan;
        using std::isinf;
        using std::signbit;

        std::ostringstream oss;
        this->set_locale(oss);

        if(isnan(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "nan";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        if(isinf(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "inf";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        switch(fmt.fmt)
        {
            case floating_format::defaultfloat:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << f;
                // since defaultfloat may omit point, we need to add it
                std::string s = oss.str();
                if (s.find('.') == std::string::npos &&
                    s.find('e') == std::string::npos &&
                    s.find('E') == std::string::npos )
                {
                    s += ".0";
                }
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    s += '_';
                    s += fmt.suffix;
                }
                return string_conv<string_type>(s);
            }
            case floating_format::fixed:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::fixed << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::scientific:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::scientific << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::hex:
            {
                if(this->spec_.ext_hex_float)
                {
                    oss << std::hexfloat << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
                else // no hex allowed. output with max precision.
                {
                    oss << std::setprecision(std::numeric_limits<floating_type>::max_digits10)
                        << std::scientific << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
            }
            default:
            {
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
        }
    }